

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O1

int ompt_set_frame_enter(void *addr,int flags,int state)

{
  kmp_info_t *pkVar1;
  kmp_taskdata_t *pkVar2;
  int iVar3;
  
  iVar3 = __kmp_get_global_thread_id_reg();
  pkVar1 = __kmp_threads[iVar3];
  pkVar2 = (pkVar1->th).th_current_task;
  (pkVar2->ompt_task_info).frame.enter_frame.ptr = addr;
  (pkVar2->ompt_task_info).frame.enter_frame_flags = flags;
  iVar3 = *(int *)(pkVar1->th_pad + 0x160);
  *(char *)((long)pkVar1 + 0x160) = '\x01';
  *(char *)((long)pkVar1 + 0x161) = '\0';
  *(char *)((long)pkVar1 + 0x162) = '\0';
  *(char *)((long)pkVar1 + 0x163) = '\0';
  return iVar3;
}

Assistant:

static int ompt_set_frame_enter(void *addr, int flags, int state) {
 return __ompt_set_frame_enter_internal(addr, flags, state);
}